

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  undefined1 auVar2 [8];
  long in_FS_OFFSET;
  undefined1 auStack_68 [8];
  printbuffer p;
  
  p.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  p.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  p.hooks.deallocate = (_func_void_void_ptr *)0x0;
  p.depth = 0;
  p.noalloc = 0;
  p.format = 0;
  p.length = 0;
  p.offset = 0;
  auStack_68 = (undefined1  [8])0x0;
  p.buffer = (uchar *)0x0;
  if (-1 < prebuffer) {
    auStack_68 = (undefined1  [8])(*global_hooks.allocate)((size_t)(ulong)(uint)prebuffer);
    if (auStack_68 != (undefined1  [8])0x0) {
      p.length = 0;
      p.depth = (ulong)(uint)fmt << 0x20;
      p._32_8_ = global_hooks.allocate;
      p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
      p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
      p.buffer = (uchar *)(ulong)(uint)prebuffer;
      cVar1 = print_value(item,(printbuffer *)auStack_68);
      auVar2 = auStack_68;
      if (cVar1 != 0) goto LAB_00102d9d;
      (*global_hooks.deallocate)((void *)auStack_68);
      auStack_68 = (undefined1  [8])0x0;
    }
  }
  auVar2 = (undefined1  [8])(uchar *)0x0;
LAB_00102d9d:
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != p.hooks.reallocate) {
    __stack_chk_fail();
  }
  return (char *)auVar2;
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        global_hooks.deallocate(p.buffer);
        p.buffer = NULL;
        return NULL;
    }

    return (char*)p.buffer;
}